

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecx_meth.c
# Opt level: O0

int pkey_ecx_derive25519(EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  int iVar1;
  uchar **in_RDX;
  size_t *in_RSI;
  uchar *in_RDI;
  uchar *pubkey;
  uchar *privkey;
  uint8_t *in_stack_ffffffffffffffc8;
  uint8_t *in_stack_ffffffffffffffd0;
  uchar **in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = validate_ecx_derive((EVP_PKEY_CTX *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              in_RSI,in_RDX,in_stack_ffffffffffffffd8);
  if (iVar1 == 0) {
LAB_00407ad7:
    iVar1 = 0;
  }
  else {
    if (in_RSI != (size_t *)0x0) {
      iVar1 = ossl_x25519(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(uint8_t *)0x407ad2);
      if (iVar1 == 0) goto LAB_00407ad7;
    }
    *in_RDX = (uchar *)0x20;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int pkey_ecx_derive25519(EVP_PKEY_CTX *ctx, unsigned char *key,
                                size_t *keylen)
{
    const unsigned char *privkey, *pubkey;

    if (!validate_ecx_derive(ctx, key, keylen, &privkey, &pubkey)
            || (key != NULL
                && ossl_x25519(key, privkey, pubkey) == 0))
        return 0;
    *keylen = X25519_KEYLEN;
    return 1;
}